

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O3

bool chibi_generate(char *in_cwd,char *src_path,char *dst_path,char **targets,int numTargets,
                   char *platform)

{
  allocator *paVar1;
  pointer ppCVar2;
  bool bVar3;
  int i;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char cVar8;
  allocator aVar9;
  string *psVar10;
  char **ppcVar11;
  char *pcVar12;
  pointer ppCVar13;
  ulong uVar14;
  pointer ppCVar15;
  bool bVar16;
  ChibiInfo chibi_info;
  char cwd [4096];
  char source_path [4096];
  char build_root [4096];
  char output_filename [4096];
  char *local_40b8;
  allocator *local_40b0;
  char *local_40a8;
  char *local_40a0;
  ChibiInfo local_4098;
  undefined1 local_4038;
  undefined7 uStack_4037;
  undefined1 local_4028 [4080];
  allocator local_3038 [4096];
  undefined1 *local_2038;
  ulong local_2030;
  undefined1 local_2028 [4080];
  char *local_1038;
  undefined8 local_1030;
  char local_1028 [4088];
  
  ppcVar11 = &local_40b8;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40b8 = dst_path;
  local_40b0 = (allocator *)src_path;
  local_40a8 = platform;
  local_40a0 = in_cwd;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numTargets) {
    uVar14 = 0;
    do {
      std::__cxx11::string::string((string *)&local_4038,targets[uVar14],local_3038);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_4098,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4038);
      if ((undefined1 *)CONCAT71(uStack_4037,local_4038) != local_4028) {
        operator_delete((undefined1 *)CONCAT71(uStack_4037,local_4038));
      }
      uVar14 = uVar14 + 1;
    } while ((uint)numTargets != uVar14);
  }
  if ((local_40a0 == (char *)0x0) || (cVar8 = *local_40a0, cVar8 == '\0')) {
    pcVar12 = &local_4038;
    pcVar5 = getcwd(pcVar12,0x1000);
    if (pcVar5 != (char *)0x0) {
      do {
        if (*pcVar12 == '\\') {
          *pcVar12 = '/';
        }
        else if (*pcVar12 == '\0') goto LAB_001091a6;
        pcVar12 = pcVar12 + 1;
      } while( true );
    }
    pcVar12 = "failed to get current working directory";
  }
  else {
    lVar7 = 0;
    do {
      lVar4 = lVar7;
      if ((int)lVar4 == 0x1000) goto LAB_00109151;
      (&local_4038)[lVar4] = cVar8;
      cVar8 = local_40a0[lVar4 + 1];
      lVar7 = lVar4 + 1;
    } while (cVar8 != '\0');
    if ((int)(lVar4 + 1) == 0x1000) {
LAB_00109151:
      pcVar12 = "failed to copy cwd string";
    }
    else {
      *(undefined1 *)((long)&uStack_4037 + lVar4) = 0;
LAB_001091a6:
      paVar1 = local_40b0;
      if ((*local_40b0 == (allocator)0x2e) && (local_40b0[1] == (allocator)0x0)) {
        if (local_4038 == (allocator)0x0) {
LAB_001092e9:
          *(undefined1 *)((long)ppcVar11 + 0x1080) = 0;
          goto LAB_001092ec;
        }
        lVar7 = 0;
        do {
          if ((int)lVar7 == 0x1000) goto LAB_00109461;
          local_3038[lVar7] = local_4038;
          local_4038 = *(allocator *)((long)&uStack_4037 + lVar7);
          lVar7 = lVar7 + 1;
        } while (local_4038 != (allocator)0x0);
LAB_001092cb:
        if ((int)lVar7 != 0x1000) {
          ppcVar11 = (char **)((long)&local_40b8 + lVar7);
          goto LAB_001092e9;
        }
LAB_00109461:
        pcVar12 = "failed to create absolute path";
      }
      else {
        local_2038 = local_2028;
        sVar6 = strlen((char *)local_40b0);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2038,paVar1,paVar1 + sVar6)
        ;
        local_1038 = local_1028;
        local_1028[0] = '.';
        local_1028[1] = '/';
        local_1030 = 2;
        local_1028[2] = 0;
        if (local_2030 < 2) {
          bVar3 = false;
        }
        else {
          lVar7 = 0;
          do {
            bVar3 = local_2038[lVar7] == local_1028[lVar7];
            if (!bVar3) break;
            bVar16 = lVar7 != 1;
            lVar7 = lVar7 + 1;
          } while (bVar16);
        }
        if (local_2038 != local_2028) {
          operator_delete(local_2038);
        }
        if (!bVar3) {
          aVar9 = *paVar1;
          ppcVar11 = &local_40b8;
          if (aVar9 != (allocator)0x0) {
            lVar7 = 0;
            do {
              if ((int)lVar7 == 0x1000) goto LAB_00109461;
              local_3038[lVar7] = aVar9;
              aVar9 = paVar1[lVar7 + 1];
              lVar7 = lVar7 + 1;
            } while (aVar9 != (allocator)0x0);
            goto LAB_001092cb;
          }
          goto LAB_001092e9;
        }
        bVar3 = chibi::concat((char *)local_3038,0x1000,&local_4038,"/",(char *)(paVar1 + 2),
                              (char *)0x0);
        if (!bVar3) goto LAB_00109461;
LAB_001092ec:
        bVar3 = find_chibi_build_root((char *)local_3038,(char *)&local_2038,0x1000);
        if (bVar3) {
          printf("source_path: %s\n",local_3038);
          printf("destination_path: %s\n",local_40b8);
          printf("build_root: %s\n",&local_2038);
          bVar3 = chibi_process(&local_4098,(char *)&local_2038,false,local_40a8);
          ppCVar2 = local_4098.libraries.
                    super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar14 = 0;
          if (!bVar3) goto LAB_00109474;
          ppCVar13 = local_4098.libraries.
                     super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (local_4098.libraries.
              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_4098.libraries.
              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar14 = 0;
            ppCVar15 = local_4098.libraries.
                       super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              bVar3 = ChibiInfo::should_build_target
                                (&local_4098,((*ppCVar15)->name)._M_dataplus._M_p);
              uVar14 = (ulong)((int)uVar14 + (uint)bVar3);
              ppCVar15 = ppCVar15 + 1;
              ppCVar13 = local_4098.libraries.
                         super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
            } while (ppCVar15 != ppCVar2);
          }
          printf("found %d libraries and apps in total, of which %d marked as target\n",
                 (ulong)((long)ppCVar13 -
                        (long)local_4098.libraries.
                              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3,uVar14);
          bVar3 = chibi::concat((char *)&local_1038,0x1000,local_40b8,"/","CMakeLists.txt",
                                (char *)0x0);
          if (!bVar3) goto LAB_00109461;
          psVar10 = &s_platform_abi_cxx11_;
          if (s_platform_full_abi_cxx11_._M_string_length != 0) {
            psVar10 = &s_platform_full_abi_cxx11_;
          }
          bVar3 = chibi::write_cmake_file
                            (&local_4098,(psVar10->_M_dataplus)._M_p,(char *)&local_1038);
          if (bVar3) {
            bVar3 = is_platform("android");
            uVar14 = 1;
            if ((!bVar3) || (bVar3 = chibi::write_gradle_files(&local_4098,local_40b8), bVar3))
            goto LAB_00109474;
            pcVar12 = "an error occured while generating gradle files";
          }
          else {
            pcVar12 = "an error occured while generating cmake file";
          }
        }
        else {
          pcVar12 = "failed to find chibi-root.txt file";
        }
      }
    }
  }
  uVar14 = 0;
  report_error((char *)0x0,pcVar12);
LAB_00109474:
  ChibiInfo::~ChibiInfo(&local_4098);
  return SUB81(uVar14,0);
}

Assistant:

bool chibi_generate(const char * in_cwd, const char * src_path, const char * dst_path, const char ** targets, const int numTargets, const char * platform)
{
	ChibiInfo chibi_info;
	
	for (int i = 0; i < numTargets; ++i)
		chibi_info.build_targets.insert(targets[i]);
	
	//
	
	char cwd[PATH_MAX];
	
	if (in_cwd == nullptr || in_cwd[0] == 0)
	{
		// get the current working directory. this is the root of our operations

		if (get_current_working_directory(cwd, sizeof(cwd)) == false)
		{
			report_error(nullptr, "failed to get current working directory");
			return false;
		}
	}
	else
	{
		if (!copy_string(cwd, sizeof(cwd), in_cwd))
		{
			report_error(nullptr, "failed to copy cwd string");
			return false;
		}
	}
	
	//
	
	char source_path[PATH_MAX];
	
	if (create_absolute_path_given_cwd(cwd, src_path, source_path, sizeof(source_path)) == false)
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}

	
	// recursively find build_root
	
	char build_root[PATH_MAX];
	
	if (find_chibi_build_root(source_path, build_root, sizeof(build_root)) == false)
	{
		report_error(nullptr, "failed to find chibi-root.txt file");
		return false;
	}
	
#if 1
	printf("source_path: %s\n", source_path);
	printf("destination_path: %s\n", dst_path);
	printf("build_root: %s\n", build_root);
#endif

	if (chibi_process(chibi_info, build_root, false, platform) == false)
		return false;
	
	int num_build_targets = 0;
	for (auto * library : chibi_info.libraries)
		if (chibi_info.should_build_target(library->name.c_str()))
			num_build_targets++;
		
	printf("found %d libraries and apps in total, of which %d marked as target\n", (int)chibi_info.libraries.size(), num_build_targets);
	
	// write cmake file
	
	char output_filename[PATH_MAX];
	
	if (!concat(output_filename, sizeof(output_filename), dst_path, "/", "CMakeLists.txt"))
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}
	
	if (!write_cmake_file(
		chibi_info,
		!s_platform_full.empty()
			? s_platform_full.c_str()
			: s_platform.c_str(),
		output_filename))
	{
		report_error(nullptr, "an error occured while generating cmake file");
		return false;
	}

	// write gradle files
	
	if (is_platform("android"))
	{
		if (!write_gradle_files(chibi_info, dst_path))
		{
			report_error(nullptr, "an error occured while generating gradle files");
			return false;
		}
	}

	return true;
}